

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

ConstTokenOrSyntax * __thiscall
slang::syntax::UdpInitialStmtSyntax::getChild
          (ConstTokenOrSyntax *__return_storage_ptr__,UdpInitialStmtSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  Token token_02;
  SyntaxNode *node;
  size_t index_local;
  UdpInitialStmtSyntax *this_local;
  
  switch(index) {
  case 0:
    token.kind = (this->initial).kind;
    token._2_1_ = (this->initial).field_0x2;
    token.numFlags.raw = (this->initial).numFlags.raw;
    token.rawLen = (this->initial).rawLen;
    token.info = (this->initial).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token);
    break;
  case 1:
    token_00.kind = (this->name).kind;
    token_00._2_1_ = (this->name).field_0x2;
    token_00.numFlags.raw = (this->name).numFlags.raw;
    token_00.rawLen = (this->name).rawLen;
    token_00.info = (this->name).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_00);
    break;
  case 2:
    token_01.kind = (this->equals).kind;
    token_01._2_1_ = (this->equals).field_0x2;
    token_01.numFlags.raw = (this->equals).numFlags.raw;
    token_01.rawLen = (this->equals).rawLen;
    token_01.info = (this->equals).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_01);
    break;
  case 3:
    node = &not_null<slang::syntax::ExpressionSyntax_*>::get(&this->value)->super_SyntaxNode;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,node);
    break;
  case 4:
    token_02.kind = (this->semi).kind;
    token_02._2_1_ = (this->semi).field_0x2;
    token_02.numFlags.raw = (this->semi).numFlags.raw;
    token_02.rawLen = (this->semi).rawLen;
    token_02.info = (this->semi).info;
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,token_02);
    break;
  default:
    ConstTokenOrSyntax::ConstTokenOrSyntax(__return_storage_ptr__,(nullptr_t)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ConstTokenOrSyntax UdpInitialStmtSyntax::getChild(size_t index) const {
    switch (index) {
        case 0: return initial;
        case 1: return name;
        case 2: return equals;
        case 3: return value.get();
        case 4: return semi;
        default: return nullptr;
    }
}